

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

void __thiscall
optTyped_nullAssignmentEmptyForNotEmpty_Test<mp::opt<long,_mp::opt_null_value_policy<long,_-1L>_>_>
::optTyped_nullAssignmentEmptyForNotEmpty_Test
          (optTyped_nullAssignmentEmptyForNotEmpty_Test<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>
           *this)

{
  anon_unknown.dwarf_df08::optTyped<mp::opt<long,_mp::opt_null_value_policy<long,_-1L>_>_>::optTyped
            (&this->super_optTyped<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>);
  (this->super_optTyped<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>).super_Test.
  _vptr_Test = (_func_int **)&PTR__Test_001cc9a0;
  return;
}

Assistant:

TYPED_TEST(optTyped, nullAssignmentEmptyForNotEmpty)
{
  using opt_type = typename TestFixture::type;
  opt_type o{this->value_1};
  o = nullopt;
  EXPECT_FALSE(o);
  EXPECT_FALSE(o.has_value());
  EXPECT_THROW(o.value(), bad_optional_access);
  EXPECT_EQ(this->value_2, o.value_or(this->value_2));
}